

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::init<Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  TypedTermList term;
  SortId in_RCX;
  UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_RDX;
  long in_RSI;
  TermList in_RDI;
  byte in_R9B;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *bd;
  UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *this_00;
  anon_class_8_1_8991fb9c bindSpecialVar;
  AbstractingUnifier *in_stack_ffffffffffffff48;
  AbstractingUnifier *in_stack_ffffffffffffff50;
  InstanceCntr local_99;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> local_98 [2];
  undefined1 in_stack_ffffffffffffffa7;
  Node *in_stack_ffffffffffffffa8;
  OptionBaseRef<Lib::BacktrackData_*> in_stack_ffffffffffffffb0;
  
  bindSpecialVar.this =
       (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *)&stack0xffffffffffffff90;
  this_00 = in_RDX;
  Kernel::AbstractingUnifier::AbstractingUnifier
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  RetrievalAlgorithms::
  UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  ::init((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
          *)in_RDI._content,(EVP_PKEY_CTX *)bindSpecialVar.this);
  Kernel::AbstractingUnifier::~AbstractingUnifier(&this_00->_unif);
  *(byte *)&(((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
               *)(in_RDI._content + 0x38))->_unif)._bd.super_OptionBase<Lib::BacktrackData_&>.
            super_OptionBaseRef<Lib::BacktrackData_*>._elem = in_R9B & 1;
  local_98[0]._isSome = false;
  local_98[0]._1_7_ = 0;
  local_98[0]._elem._elem = (Value)0x0;
  bd = local_98;
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *)
             0x413587);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_>::operator=
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *)this_00
             ,(Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *)bd);
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_>::~Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_> *)
             0x4135a5);
  *(undefined1 *)
   &(((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
       *)(in_RDI._content + 0xa8))->_unif)._constr._self._M_t.
    super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
    .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl = 0;
  InstanceCntr::InstanceCntr(&local_99,(Cntr *)(in_RSI + 0x10));
  if (in_RDX != (UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
                 *)0x0) {
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdRecord(this_00,(BacktrackData *)bd);
    term._sort._content = in_RCX._content;
    term.super_TermList._content = in_RDI._content;
    createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::init<Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>(Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node*,Kernel::TypedTermList,bool,bool,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
              ((SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *)in_RDI._content,term
               ,SUB81((ulong)this_00 >> 0x38,0),bindSpecialVar);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdDone((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
              *)0x41367b);
    Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
    ::prepareChildren((Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                       *)in_stack_ffffffffffffffb0._elem,in_stack_ffffffffffffffa8,
                      (bool)in_stack_ffffffffffffffa7);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args) {
        _algo.init(std::move(args)...);
        _retrieveSubstitution = retrieveSubstitution;
        _leafData = {};
        _normalizationRecording = false;
        _iterCntr = InstanceCntr(parent->_iterCnt);

#define DEBUG_QUERY(lvl, ...) if (lvl < 0) DBG(__VA_ARGS__)
        if(!root) {
          return;
        }

        _algo.bdRecord(_queryInitBacktrackData);
        parent->createBindings(query, reversed, 
            [&](unsigned var, TermList t) { _algo.bindQuerySpecialVar(var, t); });
        DEBUG_QUERY(1, "query: ", _algo)
        _algo.bdDone();


        prepareChildren(root, /* backtrackable */ false);
      }